

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fromClauseTermCanBeCoroutine(Parse *pParse,SrcList *pTabList,int i,int selFlags)

{
  CteUse *pCVar1;
  long lVar2;
  SrcItem *pSVar3;
  uint in_ECX;
  int in_EDX;
  SrcList *in_RSI;
  long *in_RDI;
  CteUse *pCteUse;
  SrcItem *pItem;
  SrcItem *pSVar4;
  int local_4;
  
  pSVar4 = in_RSI->a + in_EDX;
  if ((*(ushort *)&(pSVar4->fg).field_0x1 >> 9 & 1) != 0) {
    pCVar1 = (pSVar4->u2).pCteUse;
    if (pCVar1->eM10d == '\0') {
      return 0;
    }
    if ((1 < pCVar1->nUse) && (pCVar1->eM10d != '\x02')) {
      return 0;
    }
  }
  if ((in_RSI->a[0].fg.jointype & 0x40) == 0) {
    if ((*(uint *)(*in_RDI + 0x60) & 0x2000000) == 0) {
      pSVar3 = isSelfJoinView(in_RSI,(SrcItem *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pSVar4 >> 0x20)
                              ,(int)pSVar4);
      if (pSVar3 == (SrcItem *)0x0) {
        if (in_EDX == 0) {
          if (in_RSI->nSrc == 1) {
            local_4 = 1;
          }
          else if (((ulong)in_RSI[1].a[0].pSTab & 2) == 0) {
            if ((in_ECX & 0x10000000) == 0) {
              local_4 = 1;
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else if ((in_ECX & 0x10000000) == 0) {
          do {
            if (((pSVar4->fg).jointype & 0x22) != 0) {
              return 0;
            }
            if (in_EDX == 0) {
              return 1;
            }
            in_EDX = in_EDX + -1;
            lVar2 = (long)(pSVar4 + -1);
            pSVar4 = pSVar4 + -1;
          } while ((*(ushort *)(lVar2 + 0x19) >> 2 & 1) == 0);
          local_4 = 0;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int fromClauseTermCanBeCoroutine(
  Parse *pParse,          /* Parsing context */
  SrcList *pTabList,      /* FROM clause */
  int i,                  /* Which term of the FROM clause holds the subquery */
  int selFlags            /* Flags on the SELECT statement */
){
  SrcItem *pItem = &pTabList->a[i];
  if( pItem->fg.isCte ){
    const CteUse *pCteUse = pItem->u2.pCteUse;
    if( pCteUse->eM10d==M10d_Yes ) return 0;                          /* (2a) */
    if( pCteUse->nUse>=2 && pCteUse->eM10d!=M10d_No ) return 0;       /* (2b) */
  }
  if( pTabList->a[0].fg.jointype & JT_LTORJ ) return 0;               /* (3)  */
  if( OptimizationDisabled(pParse->db, SQLITE_Coroutines) ) return 0; /* (4)  */
  if( isSelfJoinView(pTabList, pItem, i+1, pTabList->nSrc)!=0 ){
    return 0;                                                          /* (5) */
  }
  if( i==0 ){
    if( pTabList->nSrc==1 ) return 1;                             /* (1a) */
    if( pTabList->a[1].fg.jointype & JT_CROSS ) return 1;         /* (1b) */
    if( selFlags & SF_UpdateFrom )              return 0;         /* (1c-iii) */
    return 1;
  }
  if( selFlags & SF_UpdateFrom ) return 0;                        /* (1c-iii) */
  while( 1 /*exit-by-break*/ ){
    if( pItem->fg.jointype & (JT_OUTER|JT_CROSS)  ) return 0;     /* (1c-ii) */
    if( i==0 ) break;
    i--;
    pItem--;
    if( pItem->fg.isSubquery ) return 0;                          /* (1c-i) */
  }
  return 1;
}